

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

shared_ptr<nigel::IM_Command> __thiscall
nigel::IMC_Generator::generateCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Command> sVar1;
  
  std::make_shared<nigel::IM_Command>();
  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_BuilderExecutable)._vptr_BuilderExecutable + 1),
             &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_BuilderExecutable)._vptr_BuilderExecutable + 3),
             &rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
  *(HexOp *)((long)(this->super_BuilderExecutable)._vptr_BuilderExecutable + 4) = operation;
  sVar1.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::IM_Command>)
         sVar1.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IM_Command> IMC_Generator::generateCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		auto cmd = std::make_shared<IM_Command>();
		cmd->op1 = lOp;
		cmd->op2 = rOp;
		cmd->operation = operation;
		return cmd;
	}